

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O0

string * __thiscall
chain::str::map_join<std::vector<long,std::allocator<long>>,main::__3>
          (string *__return_storage_ptr__,str *this,vector<long,_std::allocator<long>_> *parts,
          string_view delim,anon_class_1_0_00000001 *map)

{
  long lVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar2;
  anon_class_1_0_00000001 *this_00;
  bool bVar3;
  reference plVar4;
  int64_t iVar5;
  long *in_FS_OFFSET;
  long *part;
  const_iterator __end0;
  const_iterator __begin0;
  vector<long,_std::allocator<long>_> *__range2;
  bool first;
  allocator<char> local_51;
  string local_50 [32];
  anon_class_1_0_00000001 *local_30;
  anon_class_1_0_00000001 *map_local;
  vector<long,_std::allocator<long>_> *parts_local;
  string_view delim_local;
  
  local_30 = (anon_class_1_0_00000001 *)delim._M_str;
  delim_local._M_len = delim._M_len;
  map_local = (anon_class_1_0_00000001 *)this;
  parts_local = parts;
  delim_local._M_str = (char *)__return_storage_ptr__;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    lVar1 = *in_FS_OFFSET;
    std::__cxx11::stringstream::stringstream((stringstream *)(lVar1 + -400));
    __cxa_thread_atexit(std::__cxx11::stringstream::~stringstream,(stringstream *)(lVar1 + -400),
                        &__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  lVar1 = *in_FS_OFFSET;
  std::ios::clear(lVar1 + -400 + *(long *)(in_FS_OFFSET[-0x32] + -0x18),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_51);
  std::__cxx11::stringstream::str((string *)(lVar1 + -400));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::ios::copyfmt((ios *)(*in_FS_OFFSET + -400 +
                           *(long *)(*(long *)(*in_FS_OFFSET + -400) + -0x18)));
  this_00 = map_local;
  bVar2 = true;
  __end0 = std::vector<long,_std::allocator<long>_>::begin
                     ((vector<long,_std::allocator<long>_> *)map_local);
  part = (long *)std::vector<long,_std::allocator<long>_>::end
                           ((vector<long,_std::allocator<long>_> *)this_00);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)&part);
    if (!bVar3) break;
    plVar4 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end0);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      __str._M_str = (char *)delim_local._M_len;
      __str._M_len = (size_t)parts_local;
      std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)(*in_FS_OFFSET + -0x180),__str
                     );
    }
    lVar1 = *in_FS_OFFSET;
    iVar5 = main::anon_class_1_0_00000001::operator()(local_30,*plVar4);
    std::ostream::operator<<((ostream *)(lVar1 + -0x180),iVar5);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&__end0);
  }
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

auto map_join(const RangeType& parts, std::string_view delim, const map_functor_type& map) -> std::string
{
    thread_local std::stringstream ss{};

    ss.clear();
    ss.str("");
    ss.copyfmt(g_ss_default_fmt);

    bool first{true};
    for (const auto& part : parts)
    {
        if (first)
        {
            first = false;
        }
        else
        {
            ss << delim;
        }

        ss << map(part);
    }

    return ss.str();
}